

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall QMimeXMLProvider::ensureLoaded(QMimeXMLProvider *this)

{
  compare_eq_result_container<QList<QString>,_QString> cVar1;
  QString *file;
  QString *fileName;
  long lVar2;
  long in_FS_OFFSET;
  const_iterator __begin1;
  QString local_c8;
  DirEntry local_a8;
  QDirListing local_a0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.a.a = &(this->super_QMimeProviderBase).m_directory;
  local_60.a.b = L'\t';
  local_60.a._10_6_ = 0;
  local_60.b.d.d = (Data *)0x5b6c08;
  QStringBuilder<QString_&,_QStringView>::convertTo<QString>
            (&local_98,(QStringBuilder<QString_&,_QStringView> *)&local_60);
  QDirListing::QDirListing(&local_a0,&local_98,(IteratorFlags)0x38);
  local_a8.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_a0);
  for (; local_a8.dirListPtr != (QDirListingPrivate *)0x0; local_a8 = QDirListing::next(local_a8)) {
    QDirListing::DirEntry::fileName(&local_c8,&local_a8);
    local_60.b.d.size = local_c8.d.size;
    local_60.b.d.ptr = local_c8.d.ptr;
    local_60.b.d.d = local_c8.d.d;
    local_60.a.b = L'/';
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char16_t *)0x0;
    local_c8.d.size = 0;
    local_60.a.a = &local_98;
    QtPrivate::QMovableArrayOps<QString>::
    emplace<QStringBuilder<QStringBuilder<QString_const&,char16_t>,QString>>
              ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_60);
    QList<QString>::end((QList<QString> *)&local_78);
    if (&(local_60.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QDirListing::~QDirListing(&local_a0);
  cVar1 = QList<QString>::operator==(&this->m_allFiles,(QList<QString> *)&local_78);
  if (!cVar1) {
    QArrayDataPointer<QString>::operator=(&(this->m_allFiles).d,&local_78);
    QHash<QString,_QMimeTypeXMLData>::clear(&this->m_nameMimeTypeMap);
    QHash<QString,_QString>::clear(&this->m_aliases);
    QHash<QString,_QList<QString>_>::clear(&this->m_parents);
    QMimeAllGlobPatterns::clear(&this->m_mimeTypeGlobs);
    QList<QMimeMagicRuleMatcher>::clear(&this->m_magicMatchers);
    if (local_78.size != 0) {
      lVar2 = local_78.size * 0x18;
      fileName = local_78.ptr;
      do {
        load(this,fileName);
        fileName = fileName + 1;
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::ensureLoaded()
{
    QStringList allFiles;
    const QString packageDir = m_directory + QStringView(u"/packages");
    for (const auto &entry : QDirListing(packageDir, QDirListing::IteratorFlag::FilesOnly
                                         | QDirListing::IteratorFlag::ResolveSymlinks))
        allFiles.emplace_back(packageDir + u'/' + entry.fileName());

    if (m_allFiles == allFiles)
        return;
    m_allFiles = allFiles;

    m_nameMimeTypeMap.clear();
    m_aliases.clear();
    m_parents.clear();
    m_mimeTypeGlobs.clear();
    m_magicMatchers.clear();

    //qDebug() << "Loading" << m_allFiles;

    for (const QString &file : std::as_const(allFiles))
        load(file);
}